

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::ExpectNoErrors
          (CommandLineInterfaceTester *this)

{
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  char *pcVar1;
  AssertionResult gtest_ar_1;
  AssertHelper local_f0;
  AssertHelper local_e8 [4];
  AssertionResult gtest_ar;
  const_iterator __end2;
  string local_68 [32];
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  __end2.pos_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","return_code_",(int *)&__end2,&this->return_code_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&__end2);
    if ((undefined8 *)
        CONCAT44(gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_,
                 (State)gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)CONCAT44(gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  (State)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl);
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0x76,pcVar1);
    testing::internal::AssertHelper::operator=(local_e8,(Message *)&__end2);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    if ((long *)CONCAT44(__end2.pos_._4_4_,(undefined4)__end2.pos_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(__end2.pos_._4_4_,(undefined4)__end2.pos_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_48.text_._M_str = (this->captured_stderr_)._M_dataplus._M_p;
  local_48.text_._M_len = (this->captured_stderr_)._M_string_length;
  local_48.delimiter_.c_ = '\n';
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::begin((const_iterator *)&gtest_ar,&local_48);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::end(&__end2,&local_48);
  while (((State)gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl != __end2.state_ ||
         (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) !=
          CONCAT44(__end2.pos_._4_4_,(undefined4)__end2.pos_)))) {
    testing::HasSubstr<char[9]>
              ((PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68,(StringLike<char[9]> *)"warning:");
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
              ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_e8,(internal *)local_68,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
    ::operator()(&gtest_ar_1,(char *)local_e8,
                 (basic_string_view<char,_std::char_traits<char>_> *)0xe57f43);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string(local_68);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)local_e8);
      pcVar1 = anon_var_dwarf_651463 + 5;
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
                 ,0x7e,pcVar1);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      if (local_e8[0].data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_e8[0].data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&gtest_ar);
  }
  return;
}

Assistant:

void CommandLineInterfaceTester::ExpectNoErrors() {
  EXPECT_EQ(0, return_code_);

  // Note: since warnings and errors are both simply printed to stderr, we
  // can't holistically distinguish them here; in practice we don't have
  // multiline warnings so just counting any line with 'warning:' in it
  // is sufficient to separate warnings and errors in practice.
  for (const auto& line :
       absl::StrSplit(captured_stderr_, '\n', absl::SkipEmpty())) {
    EXPECT_THAT(line, HasSubstr("warning:"));
  }
}